

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ShowMetricsWindow::Funcs::NodeDrawCmdShowMeshAndBoundingBox
               (ImDrawList *fg_draw_list,ImDrawList *draw_list,ImDrawCmd *draw_cmd,int elem_offset,
               bool show_mesh,bool show_aabb)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  ImDrawVert *pIVar5;
  float fVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  unsigned_short *puVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  ImVec2 triangle [3];
  float local_d8;
  float local_c8;
  float local_b8;
  float local_a8;
  ImVec2 local_98 [4];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if (!show_mesh && !show_aabb) {
    __assert_fail("show_mesh || show_aabb",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x3cec,
                  "static void ImGui::ShowMetricsWindow(bool *)::Funcs::NodeDrawCmdShowMeshAndBoundingBox(ImDrawList *, const ImDrawList *, const ImDrawCmd *, int, bool, bool)"
                 );
  }
  if ((draw_list->IdxBuffer).Size < 1) {
    puVar10 = (unsigned_short *)0x0;
  }
  else {
    puVar10 = (draw_list->IdxBuffer).Data;
  }
  fVar11 = (draw_cmd->ClipRect).x;
  fVar13 = (draw_cmd->ClipRect).y;
  fVar12 = (draw_cmd->ClipRect).z;
  fVar14 = (draw_cmd->ClipRect).w;
  uVar3 = fg_draw_list->Flags;
  fg_draw_list->Flags = uVar3 & 0xfffffffe;
  if ((uint)elem_offset < draw_cmd->ElemCount + elem_offset) {
    local_78 = ZEXT416((uint)fVar11);
    local_68 = ZEXT416((uint)fVar13);
    local_58 = ZEXT416((uint)fVar12);
    local_48 = ZEXT416((uint)fVar14);
    uVar9 = (ulong)(uint)elem_offset;
    fVar12 = 3.4028235e+38;
    fVar11 = -3.4028235e+38;
    fVar13 = -3.4028235e+38;
    fVar14 = 3.4028235e+38;
    do {
      local_98[0].x = 0.0;
      local_98[0].y = 0.0;
      local_98[1].x = 0.0;
      local_98[1].y = 0.0;
      local_98[2].x = 0.0;
      local_98[2].y = 0.0;
      iVar4 = (draw_list->VtxBuffer).Size;
      lVar7 = 0;
      do {
        uVar8 = (uint)(uVar9 + lVar7);
        if (puVar10 != (unsigned_short *)0x0) {
          uVar8 = (uint)puVar10[uVar9 + lVar7 & 0xffffffff];
        }
        if (((int)uVar8 < 0) || (iVar4 <= (int)uVar8)) {
          __assert_fail("i >= 0 && i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                        ,0x5c3,
                        "const T &ImVector<ImDrawVert>::operator[](int) const [T = ImDrawVert]");
        }
        pIVar5 = (draw_list->VtxBuffer).Data;
        fVar1 = pIVar5[uVar8].pos.x;
        fVar2 = pIVar5[uVar8].pos.y;
        local_98[lVar7] = pIVar5[uVar8].pos;
        fVar6 = fVar1;
        if (fVar12 <= fVar1) {
          fVar6 = fVar12;
        }
        fVar12 = fVar6;
        fVar6 = fVar2;
        if (fVar14 <= fVar2) {
          fVar6 = fVar14;
        }
        fVar14 = fVar6;
        if (fVar1 <= fVar13) {
          fVar1 = fVar13;
        }
        fVar13 = fVar1;
        if (fVar2 <= fVar11) {
          fVar2 = fVar11;
        }
        fVar11 = fVar2;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      if (show_mesh) {
        ImDrawList::AddPolyline(fg_draw_list,local_98,3,0xff00ffff,true,1.0);
      }
      uVar9 = uVar9 + 3;
    } while ((uint)uVar9 < draw_cmd->ElemCount + elem_offset);
    local_a8 = (float)(int)fVar12;
    local_b8 = (float)(int)fVar14;
    local_c8 = (float)(int)fVar13;
    local_d8 = (float)(int)fVar11;
    fVar11 = (float)local_78._0_4_;
    fVar13 = (float)local_68._0_4_;
    fVar14 = (float)local_48._0_4_;
    fVar12 = (float)local_58._0_4_;
  }
  if (show_aabb) {
    local_98[0].y = (float)(int)fVar13;
    local_98[0].x = (float)(int)fVar11;
    local_98[3] = (ImVec2)CONCAT44((float)(int)fVar14,(float)(int)fVar12);
    ImDrawList::AddRect(fg_draw_list,local_98,local_98 + 3,0xffff00ff,0.0,0xf,1.0);
    local_98[0].y = local_b8;
    local_98[0].x = local_a8;
    local_98[3] = (ImVec2)CONCAT44(local_d8,local_c8);
    ImDrawList::AddRect(fg_draw_list,local_98,local_98 + 3,0xffffff00,0.0,0xf,1.0);
  }
  fg_draw_list->Flags = uVar3;
  return;
}

Assistant:

static void NodeDrawCmdShowMeshAndBoundingBox(ImDrawList* fg_draw_list, const ImDrawList* draw_list, const ImDrawCmd* draw_cmd, int elem_offset, bool show_mesh, bool show_aabb)
        {
            IM_ASSERT(show_mesh || show_aabb);
            ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;

            // Draw wire-frame version of all triangles
            ImRect clip_rect = draw_cmd->ClipRect;
            ImRect vtxs_rect(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
            ImDrawListFlags backup_flags = fg_draw_list->Flags;
            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
            for (unsigned int base_idx = elem_offset; base_idx < (elem_offset + draw_cmd->ElemCount); base_idx += 3)
            {
                ImVec2 triangle[3];
                for (int n = 0; n < 3; n++)
                {
                    ImVec2 p = draw_list->VtxBuffer[idx_buffer ? idx_buffer[base_idx + n] : (base_idx + n)].pos;
                    triangle[n] = p;
                    vtxs_rect.Add(p);
                }
                if (show_mesh)
                    fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), true, 1.0f); // In yellow: mesh triangles
            }
            // Draw bounding boxes
            if (show_aabb)
            {
                fg_draw_list->AddRect(ImFloor(clip_rect.Min), ImFloor(clip_rect.Max), IM_COL32(255, 0, 255, 255)); // In pink: clipping rectangle submitted to GPU
                fg_draw_list->AddRect(ImFloor(vtxs_rect.Min), ImFloor(vtxs_rect.Max), IM_COL32(0, 255, 255, 255)); // In cyan: bounding box of triangles
            }
            fg_draw_list->Flags = backup_flags;
        }